

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::JavascriptString::HasPropertyQuery
          (JavascriptString *this,PropertyId propertyId,PropertyValueInfo *info)

{
  BOOL BVar1;
  charcount_t cVar2;
  uint local_34;
  ScriptContext *pSStack_30;
  charcount_t index;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  JavascriptString *pJStack_18;
  PropertyId propertyId_local;
  JavascriptString *this_local;
  
  if (propertyId == 0xd1) {
    this_local._4_4_ = Property_Found;
  }
  else {
    scriptContext = (ScriptContext *)info;
    info_local._4_4_ = propertyId;
    pJStack_18 = this;
    pSStack_30 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
    BVar1 = ScriptContext::IsNumericPropertyId(pSStack_30,info_local._4_4_,&local_34);
    if ((BVar1 == 0) || (cVar2 = GetLength(this), cVar2 <= local_34)) {
      this_local._4_4_ = Property_NotFound;
    }
    else {
      this_local._4_4_ = Property_Found;
    }
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags JavascriptString::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        if (propertyId == PropertyIds::length)
        {
            return PropertyQueryFlags::Property_Found;
        }
        ScriptContext* scriptContext = GetScriptContext();
        charcount_t index;
        if (scriptContext->IsNumericPropertyId(propertyId, &index))
        {
            if (index < this->GetLength())
            {
                return PropertyQueryFlags::Property_Found;
            }
        }
        return PropertyQueryFlags::Property_NotFound;
    }